

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

FileName * __thiscall embree::ParseStream::getFileName(ParseStream *this)

{
  string *in_RDI;
  FileName *unaff_retaddr;
  string local_30 [40];
  string *in;
  
  in = in_RDI;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&this->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  embree::FileName::FileName(unaff_retaddr,in);
  std::__cxx11::string::~string(local_30);
  return (FileName *)in_RDI;
}

Assistant:

FileName getFileName()  {
      return FileName(get());
    }